

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O0

BufferWithRandomAccess * __thiscall
wasm::BufferWithRandomAccess::operator<<(BufferWithRandomAccess *this,int32_t x)

{
  ulong uVar1;
  ostream *poVar2;
  size_type sVar3;
  value_type_conflict2 local_18;
  value_type_conflict2 local_17;
  value_type_conflict2 local_16;
  value_type_conflict2 local_15;
  int32_t local_14;
  BufferWithRandomAccess *pBStack_10;
  int32_t x_local;
  BufferWithRandomAccess *this_local;
  
  local_14 = x;
  pBStack_10 = this;
  uVar1 = ::wasm::isDebugEnabled("binary");
  if ((uVar1 & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"writeInt32: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
    poVar2 = std::operator<<(poVar2," (at ");
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    std::operator<<(poVar2,")\n");
  }
  local_15 = (value_type_conflict2)local_14;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_15);
  local_16 = (value_type_conflict2)((uint)local_14 >> 8);
  local_14 = local_14 >> 8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_16);
  local_17 = (value_type_conflict2)((uint)local_14 >> 8);
  local_14 = local_14 >> 8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_17);
  local_18 = (value_type_conflict2)((uint)local_14 >> 8);
  local_14 = local_14 >> 8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_18);
  return this;
}

Assistant:

BufferWithRandomAccess& operator<<(int32_t x) {
    BYN_TRACE("writeInt32: " << x << " (at " << size() << ")\n");
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    return *this;
  }